

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

ON__UINT32 * __thiscall
ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle *this,field field_id,ON__UINT32 *mask)

{
  uint uVar1;
  ON__UINT32 *pOVar2;
  
  if (field_id < Count) {
    if (field_id < ExtensionLineExtension) {
      pOVar2 = (ON__UINT32 *)0x0;
    }
    else if (field_id < ExtLineColor) {
      *mask = 1 << ((byte)field_id & 0x1f);
      pOVar2 = &this->m_field_override_parent_bits0;
    }
    else {
      uVar1 = field_id - ExtLineColor >> 5;
      *mask = 1 << ((byte)field_id & 0x1f);
      if (uVar1 == 2) {
        pOVar2 = &this->m_field_override_parent_bits3;
      }
      else if (uVar1 == 1) {
        pOVar2 = &this->m_field_override_parent_bits2;
      }
      else {
        pOVar2 = &this->m_field_override_parent_bits1;
      }
    }
  }
  else {
    pOVar2 = (ON__UINT32 *)0x0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x144d,"","Invalid field_id value.");
  }
  return pOVar2;
}

Assistant:

ON__UINT32* ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle::field field_id, ON__UINT32* mask) const
{
  unsigned int bitdex = 0;
  unsigned int i = static_cast<unsigned int>(field_id);
  if (i >= static_cast<unsigned int>(ON_DimStyle::field::Count))
  {
    ON_ERROR("Invalid field_id value.");
    return nullptr;
  }

  if (i <= static_cast<unsigned int>(ON_DimStyle::field::Index))
  {
    // query makes no sense for Unset, Name and Index
    // because these cannot be inherited from parent.
    // false is returned instead of the more accurate true
    // because that's the way this code has worked for years
    // and being accurate would cause bugs at this point.
    return nullptr; 
  }

  while (i >= 32 && bitdex < 4)
  {
    bitdex++;
    i -= 32;
  }
  *mask = (1 << i);

  const ON__UINT32* bits;
  if (0 == bitdex)
    bits = &m_field_override_parent_bits0;
  else if (1 == bitdex)
    bits = &m_field_override_parent_bits1;
  else if (2 == bitdex)
    bits = &m_field_override_parent_bits2;
  else if (3 == bitdex)
    bits = &m_field_override_parent_bits3;
  else
  {
    ON_ERROR("field_id too big - add another m_independent_of_parent_bitsN = 0 member.");
    bits = nullptr;
    *mask = 0;
  }

  return const_cast<ON__UINT32*>(bits);
}